

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adler32_c.c
# Opt level: O3

uint32_t adler32_c(uint32_t adler,uint8_t *buf,size_t len)

{
  long lVar1;
  ulong uVar2;
  size_t sVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  
  uVar14 = (ulong)adler & 0xffff;
  uVar4 = (ulong)(adler >> 0x10);
  if (len == 1) {
    uVar13 = (int)uVar14 + (uint)*buf;
    uVar12 = uVar13 - 0xfff1;
    if (uVar13 < 0xfff1) {
      uVar12 = uVar13;
    }
    return (((adler >> 0x10) + uVar12) % 0xfff1) * 0x10000 + uVar12;
  }
  if (buf == (uint8_t *)0x0) {
    return 1;
  }
  if (len < 0x10) {
    if (len != 0) {
      sVar3 = 0;
      do {
        uVar12 = (int)uVar14 + (uint)buf[sVar3];
        uVar14 = (ulong)uVar12;
        uVar4 = (ulong)((int)uVar4 + uVar12);
        sVar3 = sVar3 + 1;
      } while (len != sVar3);
    }
  }
  else {
    if (len < 0x15b0) goto LAB_00103a81;
    do {
      len = len - 0x15b0;
      lVar1 = 0;
      do {
        iVar5 = (uint)buf[lVar1 * 8] + (int)uVar14;
        iVar9 = (uint)buf[lVar1 * 8 + 1] + iVar5;
        iVar6 = (uint)buf[lVar1 * 8 + 2] + iVar9;
        iVar10 = (uint)buf[lVar1 * 8 + 3] + iVar6;
        iVar7 = (uint)buf[lVar1 * 8 + 4] + iVar10;
        iVar11 = (uint)buf[lVar1 * 8 + 5] + iVar7;
        iVar8 = (uint)buf[lVar1 * 8 + 6] + iVar11;
        uVar12 = (uint)buf[lVar1 * 8 + 7] + iVar8;
        uVar14 = (ulong)uVar12;
        uVar4 = (ulong)((int)uVar4 + iVar5 + iVar9 + iVar6 + iVar10 + iVar7 + iVar11 + iVar8 +
                       uVar12);
        lVar1 = lVar1 + 1;
      } while ((int)lVar1 != 0x2b6);
      buf = buf + 0x15b0;
      uVar14 = (ulong)uVar12 % 0xfff1;
      uVar4 = uVar4 % 0xfff1;
    } while (0x15af < len);
    for (; 7 < len; len = len - 8) {
LAB_00103a81:
      iVar5 = (uint)*buf + (int)uVar14;
      iVar9 = (uint)buf[1] + iVar5;
      iVar6 = (uint)buf[2] + iVar9;
      iVar10 = (uint)buf[3] + iVar6;
      iVar7 = (uint)buf[4] + iVar10;
      iVar11 = (uint)buf[5] + iVar7;
      iVar8 = (uint)buf[6] + iVar11;
      uVar12 = (uint)buf[7] + iVar8;
      uVar14 = (ulong)uVar12;
      uVar4 = (ulong)((int)uVar4 + iVar5 + iVar9 + iVar6 + iVar10 + iVar7 + iVar11 + iVar8 + uVar12)
      ;
      buf = buf + 8;
    }
    if (len != 0) {
      uVar2 = 0;
      do {
        uVar12 = (int)uVar14 + (uint)buf[uVar2];
        uVar14 = (ulong)uVar12;
        uVar4 = (ulong)((int)uVar4 + uVar12);
        uVar2 = uVar2 + 1;
      } while (len != uVar2);
    }
  }
  return (int)(uVar4 % 0xfff1) << 0x10 | (uint)(uVar14 % 0xfff1);
}

Assistant:

Z_INTERNAL uint32_t adler32_c(uint32_t adler, const uint8_t *buf, size_t len) {
    uint32_t sum2;
    unsigned n;

    /* split Adler-32 into component sums */
    sum2 = (adler >> 16) & 0xffff;
    adler &= 0xffff;

    /* in case user likes doing a byte at a time, keep it fast */
    if (UNLIKELY(len == 1))
        return adler32_len_1(adler, buf, sum2);

    /* initial Adler-32 value (deferred check for len == 1 speed) */
    if (UNLIKELY(buf == NULL))
        return 1L;

    /* in case short lengths are provided, keep it somewhat fast */
    if (UNLIKELY(len < 16))
        return adler32_len_16(adler, buf, len, sum2);

    /* do length NMAX blocks -- requires just one modulo operation */
    while (len >= NMAX) {
        len -= NMAX;
#ifdef UNROLL_MORE
        n = NMAX / 16;          /* NMAX is divisible by 16 */
#else
        n = NMAX / 8;           /* NMAX is divisible by 8 */
#endif
        do {
#ifdef UNROLL_MORE
            ADLER_DO16(adler, sum2, buf);          /* 16 sums unrolled */
            buf += 16;
#else
            ADLER_DO8(adler, sum2, buf, 0);         /* 8 sums unrolled */
            buf += 8;
#endif
        } while (--n);
        adler %= BASE;
        sum2 %= BASE;
    }

    /* do remaining bytes (less than NMAX, still just one modulo) */
    return adler32_len_64(adler, buf, len, sum2);
}